

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O0

float ExUtilGetFloat(char *v,int *error)

{
  int *in_RSI;
  char *in_RDI;
  double dVar1;
  float f;
  char *end;
  char *local_30;
  float local_20;
  char *local_18;
  int *local_10;
  char *local_8;
  
  local_18 = (char *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDI == (char *)0x0) {
    local_20 = 0.0;
  }
  else {
    dVar1 = strtod(in_RDI,&local_18);
    local_20 = (float)dVar1;
  }
  if (((local_18 == local_8) && (local_10 != (int *)0x0)) && (*local_10 == 0)) {
    *local_10 = 1;
    if (local_8 == (char *)0x0) {
      local_30 = "(null)";
    }
    else {
      local_30 = local_8;
    }
    fprintf(stderr,"Error! \'%s\' is not a floating point number.\n",local_30);
  }
  return local_20;
}

Assistant:

float ExUtilGetFloat(const char* const v, int* const error) {
  char* end = NULL;
  const float f = (v != NULL) ? (float)strtod(v, &end) : 0.f;
  if (end == v && error != NULL && !*error) {
    *error = 1;
    fprintf(stderr, "Error! '%s' is not a floating point number.\n",
            (v != NULL) ? v : "(null)");
  }
  return f;
}